

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void image_browse_cb(Fl_Button *b,void *v)

{
  bool bVar1;
  int iVar2;
  char *oldname;
  Fluid_Image *pFVar3;
  Fl_Widget_Type *local_28;
  Fl_Type *o;
  int mod;
  void *v_local;
  Fl_Button *b_local;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x17])();
    if ((iVar2 == 0) ||
       (iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])(), iVar2 != 0)) {
      Fl_Widget::deactivate(&b->super_Fl_Widget);
    }
    else {
      Fl_Widget::activate(&b->super_Fl_Widget);
    }
  }
  else {
    bVar1 = false;
    oldname = Fl_Input_::value(&image_input->super_Fl_Input_);
    pFVar3 = ui_find_image(oldname);
    if (pFVar3 != (Fluid_Image *)0x0) {
      Fl_Input_::value(&image_input->super_Fl_Input_,ui_find_image_name);
      for (local_28 = (Fl_Widget_Type *)Fl_Type::first; local_28 != (Fl_Widget_Type *)0x0;
          local_28 = (Fl_Widget_Type *)(local_28->super_Fl_Type).next) {
        if (((local_28->super_Fl_Type).selected != '\0') &&
           (iVar2 = (*(local_28->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) {
          Fl_Widget_Type::image_name(local_28,ui_find_image_name);
          bVar1 = true;
        }
      }
      if (bVar1) {
        set_modflag(1);
      }
    }
  }
  return;
}

Assistant:

void image_browse_cb(Fl_Button* b, void *v) {
  if (v == LOAD) {
    if (current_widget->is_widget() && !current_widget->is_window())
      b->activate();
    else 
      b->deactivate();
  } else {
    int mod = 0;
    if (ui_find_image(image_input->value())) {
      image_input->value(ui_find_image_name);
      for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
	if (o->selected && o->is_widget()) {
	  ((Fl_Widget_Type*)o)->image_name(ui_find_image_name);
	  mod = 1;
	}
      }
      if (mod) set_modflag(1);
    }
  }
}